

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

LStream * newprefile(lua_State *L)

{
  LStream *pLVar1;
  LStream *p;
  lua_State *L_local;
  
  pLVar1 = (LStream *)lua_newuserdata(L,0x10);
  pLVar1->closef = (lua_CFunction)0x0;
  luaL_setmetatable(L,"FILE*");
  return pLVar1;
}

Assistant:

static LStream *newprefile (lua_State *L) {
  LStream *p = (LStream *)lua_newuserdata(L, sizeof(LStream));
  p->closef = NULL;  /* mark file handle as 'closed' */
  luaL_setmetatable(L, LUA_FILEHANDLE);
  return p;
}